

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O0

JsonObject * __thiscall Json::JsonDocument::object(JsonDocument *this)

{
  bool bVar1;
  element_type *peVar2;
  JsonDocument *local_30;
  JsonDocument *this_local;
  
  bVar1 = isObject(this);
  if (bVar1) {
    peVar2 = std::__shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)this);
    if (peVar2 == (element_type *)0x0) {
      local_30 = (JsonDocument *)0x0;
    }
    else {
      local_30 = (JsonDocument *)__dynamic_cast(peVar2,&JsonValue::typeinfo,&JsonObject::typeinfo,0)
      ;
    }
    this_local = local_30;
  }
  else {
    this_local = (JsonDocument *)0x0;
  }
  return (JsonObject *)this_local;
}

Assistant:

JsonObject *JsonDocument::object() {
        if (!isObject())return nullptr;
        return dynamic_cast<JsonObject *>(jsonValuePtr.get());
    }